

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

int __thiscall
cmMakefile::ConfigureFile
          (cmMakefile *this,string *infile,string *outfile,bool copyonly,bool atOnly,
          bool escapeQuotes,cmNewLineStyle newLine)

{
  _Ios_Openmode _Var1;
  bool bVar2;
  BOM BVar3;
  long lVar4;
  ostream *poVar5;
  uint uVar6;
  mode_t perm;
  string soutfile;
  string outLine;
  string tempOutputFile;
  string newLineCharacters;
  string path;
  byte abStack_590 [488];
  string inLine;
  ofstream fout;
  
  bVar2 = CanIWriteThisFile(this,outfile);
  if (!bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                   "Attempt to write file: ",outfile);
    std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                   " into a source directory.");
    cmSystemTools::Error(&path);
LAB_001ebc57:
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&fout);
    return 0;
  }
  bVar2 = cmsys::SystemTools::FileExists(infile);
  if (!bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                   "File ",infile);
    std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                   " does not exist.");
    cmSystemTools::Error(&path);
    goto LAB_001ebc57;
  }
  std::__cxx11::string::string((string *)&soutfile,(string *)outfile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,infile);
  cmsys::SystemTools::ConvertToUnixSlashes(&soutfile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->OutputFiles,&soutfile);
  perm = 0;
  cmsys::SystemTools::GetPermissions(infile,&perm);
  lVar4 = std::__cxx11::string::rfind((char)&soutfile,0x2f);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&path,(ulong)&soutfile);
    cmsys::SystemTools::MakeDirectory(&path,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)&path);
  }
  if (copyonly) {
    bVar2 = cmsys::SystemTools::CopyFileIfDifferent(infile,&soutfile);
    if (bVar2) {
      uVar6 = 1;
      goto LAB_001ebf3b;
    }
  }
  else {
    newLineCharacters._M_dataplus._M_p = (pointer)&newLineCharacters.field_2;
    newLineCharacters._M_string_length = 0;
    newLineCharacters.field_2._M_local_buf[0] = '\0';
    bVar2 = cmNewLineStyle::IsValid(&newLine);
    if (bVar2) {
      cmNewLineStyle::GetCharacters_abi_cxx11_(&path,&newLine);
      std::__cxx11::string::_M_assign((string *)&newLineCharacters);
      std::__cxx11::string::~string((string *)&path);
      _Var1 = _S_trunc|_S_out|_S_bin;
    }
    else {
      std::__cxx11::string::assign((char *)&newLineCharacters);
      _Var1 = _S_trunc|_S_out;
    }
    std::__cxx11::string::string((string *)&tempOutputFile,(string *)&soutfile);
    std::__cxx11::string::append((char *)&tempOutputFile);
    std::ofstream::ofstream(&fout,tempOutputFile._M_dataplus._M_p,_Var1);
    if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5
        ) == 0) {
      std::ifstream::ifstream(&path,(infile->_M_dataplus)._M_p,_S_in);
      if ((abStack_590[*(long *)(path._M_dataplus._M_p + -0x18)] & 5) == 0) {
        BVar3 = cmsys::FStream::ReadBOM((istream *)&path);
        if (BOM_UTF8 < BVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&inLine);
          poVar5 = std::operator<<((ostream *)&inLine,
                                   "File starts with a Byte-Order-Mark that is not UTF-8:\n  ");
          std::operator<<(poVar5,(string *)infile);
          std::__cxx11::stringbuf::str();
          IssueMessage(this,FATAL_ERROR,&outLine);
          std::__cxx11::string::~string((string *)&outLine);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inLine);
          goto LAB_001ebf01;
        }
        std::istream::seekg(&path,0,0);
        inLine._M_dataplus._M_p = (pointer)&inLine.field_2;
        inLine._M_string_length = 0;
        inLine.field_2._M_local_buf[0] = '\0';
        outLine._M_dataplus._M_p = (pointer)&outLine.field_2;
        outLine._M_string_length = 0;
        outLine.field_2._M_local_buf[0] = '\0';
        while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                 ((istream *)&path,&inLine,(bool *)0x0,-1), bVar2) {
          outLine._M_string_length = 0;
          *outLine._M_dataplus._M_p = '\0';
          ConfigureString(this,&inLine,&outLine,atOnly,escapeQuotes);
          poVar5 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (string *)&outLine);
          std::operator<<(poVar5,(string *)&newLineCharacters);
        }
        std::ifstream::close();
        std::ofstream::close();
        bVar2 = cmsys::SystemTools::CopyFileIfDifferent(&tempOutputFile,&soutfile);
        if (bVar2) {
          cmsys::SystemTools::SetPermissions(&soutfile,perm,false);
        }
        uVar6 = (uint)bVar2;
        cmsys::SystemTools::RemoveFile(&tempOutputFile);
        std::__cxx11::string::~string((string *)&outLine);
        std::__cxx11::string::~string((string *)&inLine);
        bVar2 = true;
      }
      else {
        std::operator+(&inLine,"Could not open file for read in copy operation ",infile);
        cmSystemTools::Error(&inLine);
        std::__cxx11::string::~string((string *)&inLine);
LAB_001ebf01:
        uVar6 = 1;
        bVar2 = false;
      }
      std::ifstream::~ifstream(&path);
    }
    else {
      std::operator+(&path,"Could not open file for write in copy operation ",&tempOutputFile);
      cmSystemTools::Error(&path);
      std::__cxx11::string::~string((string *)&path);
      cmSystemTools::ReportLastSystemError("");
      uVar6 = 1;
      bVar2 = false;
    }
    std::ofstream::~ofstream(&fout);
    std::__cxx11::string::~string((string *)&tempOutputFile);
    std::__cxx11::string::~string((string *)&newLineCharacters);
    if (bVar2) goto LAB_001ebf3b;
  }
  uVar6 = 0;
LAB_001ebf3b:
  std::__cxx11::string::~string((string *)&soutfile);
  return uVar6;
}

Assistant:

int cmMakefile::ConfigureFile(const std::string& infile,
                              const std::string& outfile, bool copyonly,
                              bool atOnly, bool escapeQuotes,
                              cmNewLineStyle newLine)
{
  int res = 1;
  if (!this->CanIWriteThisFile(outfile)) {
    cmSystemTools::Error("Attempt to write file: " + outfile +
                         " into a source directory.");
    return 0;
  }
  if (!cmSystemTools::FileExists(infile)) {
    cmSystemTools::Error("File " + infile + " does not exist.");
    return 0;
  }
  std::string soutfile = outfile;
  const std::string& sinfile = infile;
  this->AddCMakeDependFile(sinfile);
  cmSystemTools::ConvertToUnixSlashes(soutfile);

  // Re-generate if non-temporary outputs are missing.
  // when we finalize the configuration we will remove all
  // output files that now don't exist.
  this->AddCMakeOutputFile(soutfile);

  mode_t perm = 0;
  cmSystemTools::GetPermissions(sinfile, perm);
  std::string::size_type pos = soutfile.rfind('/');
  if (pos != std::string::npos) {
    std::string path = soutfile.substr(0, pos);
    cmSystemTools::MakeDirectory(path);
  }

  if (copyonly) {
    if (!cmSystemTools::CopyFileIfDifferent(sinfile, soutfile)) {
      return 0;
    }
  } else {
    std::string newLineCharacters;
    std::ios::openmode omode = std::ios::out | std::ios::trunc;
    if (newLine.IsValid()) {
      newLineCharacters = newLine.GetCharacters();
      omode |= std::ios::binary;
    } else {
      newLineCharacters = "\n";
    }
    std::string tempOutputFile = soutfile;
    tempOutputFile += ".tmp";
    cmsys::ofstream fout(tempOutputFile.c_str(), omode);
    if (!fout) {
      cmSystemTools::Error("Could not open file for write in copy operation " +
                           tempOutputFile);
      cmSystemTools::ReportLastSystemError("");
      return 0;
    }
    cmsys::ifstream fin(sinfile.c_str());
    if (!fin) {
      cmSystemTools::Error("Could not open file for read in copy operation " +
                           sinfile);
      return 0;
    }

    cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
    if (bom != cmsys::FStream::BOM_None && bom != cmsys::FStream::BOM_UTF8) {
      std::ostringstream e;
      e << "File starts with a Byte-Order-Mark that is not UTF-8:\n  "
        << sinfile;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return 0;
    }
    // rewind to copy BOM to output file
    fin.seekg(0);

    // now copy input to output and expand variables in the
    // input file at the same time
    std::string inLine;
    std::string outLine;
    while (cmSystemTools::GetLineFromStream(fin, inLine)) {
      outLine.clear();
      this->ConfigureString(inLine, outLine, atOnly, escapeQuotes);
      fout << outLine << newLineCharacters;
    }
    // close the files before attempting to copy
    fin.close();
    fout.close();
    if (!cmSystemTools::CopyFileIfDifferent(tempOutputFile, soutfile)) {
      res = 0;
    } else {
      cmSystemTools::SetPermissions(soutfile, perm);
    }
    cmSystemTools::RemoveFile(tempOutputFile);
  }
  return res;
}